

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void av1_set_offsets(AV1_COMP *cpi,TileInfo *tile,MACROBLOCK *x,int mi_row,int mi_col,
                    BLOCK_SIZE bsize)

{
  int iVar1;
  MB_MODE_INFO *pMVar2;
  int iVar3;
  ushort uVar4;
  uint segment_id;
  EncSegmentationInfo *pEVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  ulong uVar11;
  byte bVar10;
  
  av1_set_offsets_without_segment_id(cpi,tile,x,mi_row,mi_col,bsize);
  pMVar2 = *(x->e_mbd).mi;
  uVar4 = *(ushort *)&pMVar2->field_0xa7 & 0xfff8;
  *(ushort *)&pMVar2->field_0xa7 = uVar4;
  if ((cpi->common).seg.enabled == '\0') {
    return;
  }
  segment_id = 0;
  if (cpi->vaq_refresh == 0) {
    pEVar5 = &cpi->enc_seg;
    if ((cpi->common).seg.update_map == '\0') {
      pEVar5 = (EncSegmentationInfo *)&(cpi->common).last_frame_seg_map;
    }
    segment_id = 0;
    if (pEVar5->map != (uint8_t *)0x0) {
      iVar1 = (cpi->common).mi_params.mi_cols;
      uVar8 = iVar1 - mi_col;
      if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [bsize] <= iVar1 - mi_col) {
        uVar8 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [bsize];
      }
      uVar7 = (cpi->common).mi_params.mi_rows - mi_row;
      if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bsize] <= (int)uVar7) {
        uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [bsize];
      }
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      iVar6 = mi_row * iVar1 + mi_col;
      bVar10 = 8;
      bVar9 = 0;
      for (; uVar11 = (ulong)uVar8, iVar3 = iVar6, segment_id != uVar7; segment_id = segment_id + 1)
      {
        while (uVar11 != 0) {
          bVar9 = pEVar5->map[iVar3];
          if (bVar10 < bVar9) {
            bVar9 = bVar10;
          }
          uVar11 = uVar11 - 1;
          bVar10 = bVar9;
          iVar3 = iVar3 + 1;
        }
        iVar6 = iVar6 + iVar1;
      }
      segment_id = (uint)(bVar9 & 7);
    }
    *(ushort *)&pMVar2->field_0xa7 = uVar4 | (ushort)segment_id;
  }
  av1_init_plane_quantizers(cpi,x,segment_id,0);
  return;
}

Assistant:

void av1_set_offsets(const AV1_COMP *const cpi, const TileInfo *const tile,
                     MACROBLOCK *const x, int mi_row, int mi_col,
                     BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const struct segmentation *const seg = &cm->seg;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi;

  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);

  // Setup segment ID.
  mbmi = xd->mi[0];
  mbmi->segment_id = 0;
  if (seg->enabled) {
    if (seg->enabled && !cpi->vaq_refresh) {
      const uint8_t *const map =
          seg->update_map ? cpi->enc_seg.map : cm->last_frame_seg_map;
      mbmi->segment_id =
          map ? get_segment_id(&cm->mi_params, map, bsize, mi_row, mi_col) : 0;
    }
    av1_init_plane_quantizers(cpi, x, mbmi->segment_id, 0);
  }
#ifndef NDEBUG
  x->last_set_offsets_loc.mi_row = mi_row;
  x->last_set_offsets_loc.mi_col = mi_col;
  x->last_set_offsets_loc.bsize = bsize;
#endif  // NDEBUG
}